

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

void __thiscall argagg::fmt_ostream::~fmt_ostream(fmt_ostream *this)

{
  ~fmt_ostream(this,&VTT);
  std::ios_base::~ios_base
            ((ios_base *)
             &(this->super_ostringstream).super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x78);
  return;
}

Assistant:

inline
fmt_ostream::~fmt_ostream()
{
  output << fmt_string(this->str());
}